

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int windowCodeOp(WindowCodeArg *p,int op,int regCountdown,int jumpOnEof)

{
  u8 uVar1;
  int nReg;
  Parse *pParse;
  Window *pMWin;
  Vdbe *p_00;
  uint uVar2;
  int iVar3;
  int reg;
  int nReg_00;
  int lbl;
  int iVar4;
  bool bVar5;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_44;
  
  pParse = p->pParse;
  pMWin = p->pMWin;
  p_00 = p->pVdbe;
  uVar1 = pMWin->eFrmType;
  lbl = pParse->nLabel + -1;
  pParse->nLabel = lbl;
  if ((op == 2) && (pMWin->eStart == 'W')) {
    return 0;
  }
  local_44 = 0;
  local_54 = 0;
  if (regCountdown < 1) {
LAB_0017b611:
    if (op == 1) {
LAB_0017b61b:
      if (pMWin->regStartRowid == 0) {
        windowAggFinal(p,0);
      }
      local_58 = p_00->nOp;
      local_50 = (p->current).csr;
      local_4c = (p->current).reg;
      windowReturnOneRow(p);
    }
    else {
      local_44 = 0;
      local_58 = p_00->nOp;
      if (op == 2) goto LAB_0017b676;
LAB_0017b6eb:
      local_50 = (p->end).csr;
      local_4c = (p->end).reg;
      if (pMWin->regStartRowid != 0) {
        iVar3 = pMWin->regEndRowid;
        goto LAB_0017b70b;
      }
      iVar3 = p->regArg;
      iVar4 = 0;
LAB_0017b726:
      windowAggStep(pParse,pMWin,local_50,iVar4,iVar3);
    }
  }
  else {
    if (uVar1 != 'V') {
      local_54 = sqlite3VdbeAddOp3(p_00,0x2f,regCountdown,0,1);
      goto LAB_0017b611;
    }
    local_44 = p_00->nOp;
    if (op != 2) {
      windowCodeRangeTest(p,0x36,(p->end).csr,regCountdown,(p->current).csr,lbl);
      if (op != 1) {
        local_58 = p_00->nOp;
        local_54 = 0;
        goto LAB_0017b6eb;
      }
      local_54 = 0;
      goto LAB_0017b61b;
    }
    bVar5 = pMWin->eStart == 'S';
    uVar2 = (uint)!bVar5;
    windowCodeRangeTest(p,uVar2 * 2 + 0x37,(&p->start)[bVar5].csr,regCountdown,
                        (&p->start)[uVar2].csr,lbl);
    local_58 = p_00->nOp;
    local_54 = 0;
LAB_0017b676:
    local_50 = (p->start).csr;
    local_4c = (p->start).reg;
    iVar3 = pMWin->regStartRowid;
    if (iVar3 == 0) {
      iVar3 = p->regArg;
      iVar4 = 1;
      goto LAB_0017b726;
    }
LAB_0017b70b:
    sqlite3VdbeAddOp2(p_00,0x53,iVar3,1);
  }
  if (p->eDelete == op) {
    sqlite3VdbeAddOp1(p_00,0x7b,local_50);
    if (0 < (long)p_00->nOp) {
      p_00->aOp[(long)p_00->nOp + -1].p5 = 2;
    }
  }
  if (jumpOnEof == 0) {
    sqlite3VdbeAddOp2(p_00,5,local_50,(p_00->nOp - (uint)(uVar1 == 'L')) + 2);
    iVar3 = 0;
    iVar4 = 0;
    if (uVar1 == 'L') goto LAB_0017b854;
    iVar4 = sqlite3VdbeAddOp0(p_00,0xb);
    iVar3 = 0;
  }
  else {
    sqlite3VdbeAddOp2(p_00,5,local_50,p_00->nOp + 2);
    iVar3 = sqlite3VdbeAddOp0(p_00,0xb);
    iVar4 = 0;
    if (uVar1 == 'L') goto LAB_0017b854;
  }
  nReg_00 = 0;
  if (pMWin->pOrderBy == (ExprList *)0x0) {
    reg = 0;
  }
  else {
    nReg = pMWin->pOrderBy->nExpr;
    reg = 0;
    nReg_00 = 0;
    if (nReg != 0) {
      reg = sqlite3GetTempRange(pParse,nReg);
      nReg_00 = nReg;
    }
  }
  windowReadPeerValues(p,local_50,reg);
  windowIfNewPeer(pParse,pMWin->pOrderBy,reg,local_4c,local_58);
  sqlite3ReleaseTempRange(pParse,reg,nReg_00);
LAB_0017b854:
  if (local_44 != 0) {
    sqlite3VdbeAddOp2(p_00,0xb,0,local_44);
  }
  sqlite3VdbeResolveLabel(p_00,lbl);
  if (iVar4 != 0) {
    sqlite3VdbeJumpHere(p_00,iVar4);
  }
  if (local_54 != 0) {
    sqlite3VdbeJumpHere(p_00,local_54);
  }
  return iVar3;
}

Assistant:

static int windowCodeOp(
 WindowCodeArg *p,                /* Context object */
 int op,                          /* WINDOW_RETURN_ROW, AGGSTEP or AGGINVERSE */
 int regCountdown,                /* Register for OP_IfPos countdown */
 int jumpOnEof                    /* Jump here if stepped cursor reaches EOF */
){
  int csr, reg;
  Parse *pParse = p->pParse;
  Window *pMWin = p->pMWin;
  int ret = 0;
  Vdbe *v = p->pVdbe;
  int addrIf = 0; 
  int addrContinue = 0;
  int addrGoto = 0;
  int bPeer = (pMWin->eFrmType!=TK_ROWS);

  int lblDone = sqlite3VdbeMakeLabel(pParse);
  int addrNextRange = 0;

  /* Special case - WINDOW_AGGINVERSE is always a no-op if the frame
  ** starts with UNBOUNDED PRECEDING. */
  if( op==WINDOW_AGGINVERSE && pMWin->eStart==TK_UNBOUNDED ){
    assert( regCountdown==0 && jumpOnEof==0 );
    return 0;
  }

  if( regCountdown>0 ){
    if( pMWin->eFrmType==TK_RANGE ){
      addrNextRange = sqlite3VdbeCurrentAddr(v);
      assert( op==WINDOW_AGGINVERSE || op==WINDOW_AGGSTEP );
      if( op==WINDOW_AGGINVERSE ){
        if( pMWin->eStart==TK_FOLLOWING ){
          windowCodeRangeTest(
              p, OP_Le, p->current.csr, regCountdown, p->start.csr, lblDone
          );
        }else{
          windowCodeRangeTest(
              p, OP_Ge, p->start.csr, regCountdown, p->current.csr, lblDone
          );
        }
      }else{
        windowCodeRangeTest(
            p, OP_Gt, p->end.csr, regCountdown, p->current.csr, lblDone
        );
      }
    }else{
      addrIf = sqlite3VdbeAddOp3(v, OP_IfPos, regCountdown, 0, 1);
      VdbeCoverage(v);
    }
  }

  if( op==WINDOW_RETURN_ROW && pMWin->regStartRowid==0 ){
    windowAggFinal(p, 0);
  }
  addrContinue = sqlite3VdbeCurrentAddr(v);
  switch( op ){
    case WINDOW_RETURN_ROW:
      csr = p->current.csr;
      reg = p->current.reg;
      windowReturnOneRow(p);
      break;

    case WINDOW_AGGINVERSE:
      csr = p->start.csr;
      reg = p->start.reg;
      if( pMWin->regStartRowid ){
        assert( pMWin->regEndRowid );
        sqlite3VdbeAddOp2(v, OP_AddImm, pMWin->regStartRowid, 1);
      }else{
        windowAggStep(pParse, pMWin, csr, 1, p->regArg);
      }
      break;

    default:
      assert( op==WINDOW_AGGSTEP );
      csr = p->end.csr;
      reg = p->end.reg;
      if( pMWin->regStartRowid ){
        assert( pMWin->regEndRowid );
        sqlite3VdbeAddOp2(v, OP_AddImm, pMWin->regEndRowid, 1);
      }else{
        windowAggStep(pParse, pMWin, csr, 0, p->regArg);
      }
      break;
  }

  if( op==p->eDelete ){
    sqlite3VdbeAddOp1(v, OP_Delete, csr);
    sqlite3VdbeChangeP5(v, OPFLAG_SAVEPOSITION);
  }

  if( jumpOnEof ){
    sqlite3VdbeAddOp2(v, OP_Next, csr, sqlite3VdbeCurrentAddr(v)+2);
    VdbeCoverage(v);
    ret = sqlite3VdbeAddOp0(v, OP_Goto);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, csr, sqlite3VdbeCurrentAddr(v)+1+bPeer);
    VdbeCoverage(v);
    if( bPeer ){
      addrGoto = sqlite3VdbeAddOp0(v, OP_Goto);
    }
  }

  if( bPeer ){
    int nReg = (pMWin->pOrderBy ? pMWin->pOrderBy->nExpr : 0);
    int regTmp = (nReg ? sqlite3GetTempRange(pParse, nReg) : 0);
    windowReadPeerValues(p, csr, regTmp);
    windowIfNewPeer(pParse, pMWin->pOrderBy, regTmp, reg, addrContinue);
    sqlite3ReleaseTempRange(pParse, regTmp, nReg);
  }

  if( addrNextRange ){
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrNextRange);
  }
  sqlite3VdbeResolveLabel(v, lblDone);
  if( addrGoto ) sqlite3VdbeJumpHere(v, addrGoto);
  if( addrIf ) sqlite3VdbeJumpHere(v, addrIf);
  return ret;
}